

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::AnnotatedHandler::gatherForEncode
          (AnnotatedHandler *this,JsonCodec *codec,Reader *input,StringPtr prefix,
          StringPtr morePrefix,
          Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *flattenedFields)

{
  AnnotatedHandler *pAVar1;
  ArrayPtr<const_char> AVar2;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  StringPtr prefix_00;
  StringPtr prefix_01;
  StringPtr prefix_02;
  StringPtr prefix_03;
  StringPtr prefix_04;
  bool bVar3;
  uint uVar4;
  FieldInfo *pFVar5;
  Type TVar6;
  Field field;
  String ownPrefix;
  ReaderFor<capnp::DynamicStruct> reader;
  NullableValue<capnp::StructSchema::Field> _which1269;
  StructSchema schema;
  StringPtr *local_458;
  size_t sStack_450;
  Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *local_440;
  AnnotatedHandler *local_438;
  uint local_42c;
  Field local_428;
  Array<char> local_3e8;
  JsonCodec *local_3c8;
  IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field> local_3c0;
  ReaderFor<DynamicStruct> local_3b0;
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_378;
  undefined1 local_330 [16];
  ArrayDisposer *pAStack_320;
  SegmentReader *local_318;
  CapTableReader *pCStack_310;
  void *local_308;
  undefined8 uStack_300;
  uint16_t *local_2f8;
  uint uStack_2f0;
  undefined4 uStack_2ec;
  Schema local_2e8;
  undefined1 local_2e0 [48];
  anon_union_64_1_a8a2e026_for_OneOf<capnp::StructSchema::Field,_capnp::Type>_2 aaStack_2b0 [2];
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_228;
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_1e0;
  Reader local_198;
  Reader local_150;
  Reader local_108;
  Reader local_c0;
  Reader local_78;
  
  sStack_450 = prefix.content.size_;
  local_458 = (StringPtr *)prefix.content.ptr;
  local_3e8.disposer = (ArrayDisposer *)0x0;
  local_3e8.ptr = (char *)0x0;
  local_3e8.size_ = 0;
  local_440 = flattenedFields;
  local_438 = this;
  if (morePrefix.content.size_ != 1) {
    if (sStack_450 == 1) {
      local_458 = (StringPtr *)morePrefix.content.ptr;
      sStack_450 = morePrefix.content.size_;
    }
    else {
      kj::str<kj::StringPtr&,kj::StringPtr&>
                ((String *)local_2e0,(kj *)&local_458,&morePrefix,local_458);
      kj::Array<char>::operator=(&local_3e8,(Array<char> *)local_2e0);
      kj::Array<char>::~Array((Array<char> *)local_2e0);
      local_458 = (StringPtr *)local_3e8.ptr;
      if (local_3e8.size_ == 0) {
        local_458 = (StringPtr *)0x20b013;
      }
      sStack_450 = local_3e8.size_ + (local_3e8.size_ == 0);
    }
  }
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_3b0,input);
  local_2e8 = local_3b0.schema.super_Schema.raw;
  StructSchema::getNonUnionFields((FieldSubset *)local_330,(StructSchema *)&local_2e8);
  local_42c = uStack_2f0;
  uVar4 = uStack_2f0;
  local_3c8 = codec;
  local_3c0.container = (FieldSubset *)local_330;
  for (local_3c0.index = 0; local_3c0.index != uVar4; local_3c0.index = local_3c0.index + 1) {
    capnp::_::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
    operator*(&local_428,&local_3c0);
    pFVar5 = (local_438->fields).ptr + (local_428._8_8_ & 0xffffffff);
    field_00.index = local_428.index;
    field_00._12_4_ = local_428._12_4_;
    field_00.parent.super_Schema.raw = local_428.parent.super_Schema.raw;
    field_00.proto._reader.segment = local_428.proto._reader.segment;
    field_00.proto._reader.capTable = local_428.proto._reader.capTable;
    field_00.proto._reader.data = local_428.proto._reader.data;
    field_00.proto._reader.pointers = local_428.proto._reader.pointers;
    field_00.proto._reader.dataSize = local_428.proto._reader.dataSize;
    field_00.proto._reader.pointerCount = local_428.proto._reader.pointerCount;
    field_00.proto._reader._38_2_ = local_428.proto._reader._38_2_;
    field_00.proto._reader.nestingLimit = local_428.proto._reader.nestingLimit;
    field_00.proto._reader._44_4_ = local_428.proto._reader._44_4_;
    bVar3 = DynamicStruct::Reader::has(&local_3b0,field_00,((codec->impl).ptr)->hasMode);
    if (bVar3) {
      pAVar1 = (pFVar5->flattenHandler).ptr;
      if (pAVar1 == (AnnotatedHandler *)0x0) {
        prefix_01.content.size_ = sStack_450;
        prefix_01.content.ptr = (char *)local_458;
        AVar2 = (pFVar5->name).content;
        local_228.tag = 1;
        local_228.field_1._48_4_ = local_428.proto._reader.dataSize;
        local_228.field_1._52_2_ = local_428.proto._reader.pointerCount;
        local_228.field_1._54_2_ = local_428.proto._reader._38_2_;
        local_228.field_1._56_8_ = local_428.proto._reader._40_8_;
        local_228.field_1._32_8_ = local_428.proto._reader.data;
        local_228.field_1._40_8_ = local_428.proto._reader.pointers;
        local_228.field_1._16_8_ = local_428.proto._reader.segment;
        local_228.field_1._24_8_ = local_428.proto._reader.capTable;
        local_228.field_1._0_8_ = local_428.parent.super_Schema.raw;
        local_228.field_1._8_8_ = local_428._8_8_;
        field_02.index = local_428.index;
        field_02._12_4_ = local_428._12_4_;
        field_02.parent.super_Schema.raw = local_428.parent.super_Schema.raw;
        field_02.proto._reader.segment = local_428.proto._reader.segment;
        field_02.proto._reader.capTable = local_428.proto._reader.capTable;
        field_02.proto._reader.data = local_428.proto._reader.data;
        field_02.proto._reader.pointers = local_428.proto._reader.pointers;
        field_02.proto._reader.dataSize = local_428.proto._reader.dataSize;
        field_02.proto._reader.pointerCount = local_428.proto._reader.pointerCount;
        field_02.proto._reader._38_2_ = local_428.proto._reader._38_2_;
        field_02.proto._reader.nestingLimit = local_428.proto._reader.nestingLimit;
        field_02.proto._reader._44_4_ = local_428.proto._reader._44_4_;
        DynamicStruct::Reader::get(&local_c0,&local_3b0,field_02);
        FlattenedField::FlattenedField
                  ((FlattenedField *)local_2e0,prefix_01,(StringPtr)AVar2,&local_228,&local_c0);
        kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
        add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
                  (local_440,(FlattenedField *)local_2e0);
        FlattenedField::~FlattenedField((FlattenedField *)local_2e0);
        DynamicValue::Reader::~Reader(&local_c0);
        codec = local_3c8;
        uVar4 = local_42c;
        if (local_228.tag - 1 < 2) {
          local_228.tag = 0;
        }
      }
      else {
        field_01.index = local_428.index;
        field_01._12_4_ = local_428._12_4_;
        field_01.parent.super_Schema.raw = local_428.parent.super_Schema.raw;
        field_01.proto._reader.segment = local_428.proto._reader.segment;
        field_01.proto._reader.capTable = local_428.proto._reader.capTable;
        field_01.proto._reader.data = local_428.proto._reader.data;
        field_01.proto._reader.pointers = local_428.proto._reader.pointers;
        field_01.proto._reader.dataSize = local_428.proto._reader.dataSize;
        field_01.proto._reader.pointerCount = local_428.proto._reader.pointerCount;
        field_01.proto._reader._38_2_ = local_428.proto._reader._38_2_;
        field_01.proto._reader.nestingLimit = local_428.proto._reader.nestingLimit;
        field_01.proto._reader._44_4_ = local_428.proto._reader._44_4_;
        DynamicStruct::Reader::get(&local_78,&local_3b0,field_01);
        prefix_00.content.size_ = sStack_450;
        prefix_00.content.ptr = (char *)local_458;
        gatherForEncode(pAVar1,codec,&local_78,prefix_00,(StringPtr)(pFVar5->prefix).content,
                        local_440);
        DynamicValue::Reader::~Reader(&local_78);
      }
    }
  }
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)local_2e0,&local_3b0);
  local_330[0] = local_2e0[0];
  if (local_2e0[0] != false) {
    local_2f8 = (uint16_t *)aaStack_2b0[0]._8_8_;
    _uStack_2f0 = aaStack_2b0[0]._16_8_;
    local_308 = (void *)local_2e0._40_8_;
    uStack_300 = aaStack_2b0[0]._0_8_;
    local_318 = (SegmentReader *)local_2e0._24_8_;
    pCStack_310 = (CapTableReader *)local_2e0._32_8_;
    local_330._8_8_ = local_2e0._8_8_;
    pAStack_320 = (ArrayDisposer *)local_2e0._16_8_;
    pFVar5 = (local_438->fields).ptr + (local_2e0._16_8_ & 0xffffffff);
    if ((local_438->unionTagName).ptr.isSet == true) {
      prefix_02.content.size_ = sStack_450;
      prefix_02.content.ptr = (char *)local_458;
      local_1e0.tag = 2;
      local_1e0.field_1._0_4_ = 0xc;
      local_1e0.field_1._8_8_ = 0;
      local_428.parent.super_Schema.raw = (Schema)(pFVar5->nameForDiscriminant).content.ptr;
      local_428._8_8_ = (pFVar5->nameForDiscriminant).content.size_;
      local_108.type = TEXT;
      local_108.field_1.intValue = (int64_t)local_428.parent.super_Schema.raw;
      local_108.field_1.textValue.super_StringPtr.content.size_ = local_428._8_8_;
      FlattenedField::FlattenedField
                ((FlattenedField *)local_2e0,prefix_02,
                 (StringPtr)(local_438->unionTagName).ptr.field_1.value.content,&local_1e0,
                 &local_108);
      kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
      add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>(local_440,(FlattenedField *)local_2e0)
      ;
      FlattenedField::~FlattenedField((FlattenedField *)local_2e0);
      DynamicValue::Reader::~Reader(&local_108);
      if (local_1e0.tag - 1 < 2) {
        local_1e0.tag = 0;
      }
    }
    pAVar1 = (pFVar5->flattenHandler).ptr;
    if (pAVar1 == (AnnotatedHandler *)0x0) {
      TVar6 = StructSchema::Field::getType((Field *)(local_330 + 8));
      if ((((undefined1  [16])TVar6 & (undefined1  [16])0xffffff) != (undefined1  [16])0x0) ||
         (((local_438->unionTagName).ptr.isSet & 1U) == 0)) {
        prefix_04.content.size_ = sStack_450;
        prefix_04.content.ptr = (char *)local_458;
        AVar2 = (pFVar5->name).content;
        local_378.tag = 1;
        local_378.field_1._0_8_ = local_330._8_8_;
        local_378.field_1._8_8_ = pAStack_320;
        local_378.field_1._16_8_ = local_318;
        local_378.field_1._24_8_ = pCStack_310;
        local_378.field_1._32_8_ = local_308;
        local_378.field_1._40_8_ = uStack_300;
        local_378.field_1._48_8_ = local_2f8;
        local_378.field_1._56_8_ = _uStack_2f0;
        field_04._8_8_ = pAStack_320;
        field_04.parent.super_Schema.raw = (Schema)(Schema)local_330._8_8_;
        field_04.proto._reader.segment = local_318;
        field_04.proto._reader.capTable = pCStack_310;
        field_04.proto._reader.data = local_308;
        field_04.proto._reader.pointers = (WirePointer *)uStack_300;
        field_04.proto._reader._32_8_ = local_2f8;
        field_04.proto._reader.nestingLimit = uStack_2f0;
        field_04.proto._reader._44_4_ = uStack_2ec;
        DynamicStruct::Reader::get(&local_150,&local_3b0,field_04);
        FlattenedField::FlattenedField
                  ((FlattenedField *)local_2e0,prefix_04,(StringPtr)AVar2,&local_378,&local_150);
        kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
        add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
                  (local_440,(FlattenedField *)local_2e0);
        FlattenedField::~FlattenedField((FlattenedField *)local_2e0);
        DynamicValue::Reader::~Reader(&local_150);
        if (local_378.tag - 1 < 2) {
          local_378.tag = 0;
        }
      }
    }
    else {
      field_03._8_8_ = pAStack_320;
      field_03.parent.super_Schema.raw = (Schema)(Schema)local_330._8_8_;
      field_03.proto._reader.segment = local_318;
      field_03.proto._reader.capTable = pCStack_310;
      field_03.proto._reader.data = local_308;
      field_03.proto._reader.pointers = (WirePointer *)uStack_300;
      field_03.proto._reader._32_8_ = local_2f8;
      field_03.proto._reader.nestingLimit = uStack_2f0;
      field_03.proto._reader._44_4_ = uStack_2ec;
      DynamicStruct::Reader::get(&local_198,&local_3b0,field_03);
      prefix_03.content.size_ = sStack_450;
      prefix_03.content.ptr = (char *)local_458;
      gatherForEncode(pAVar1,codec,&local_198,prefix_03,(StringPtr)(pFVar5->prefix).content,
                      local_440);
      DynamicValue::Reader::~Reader(&local_198);
    }
  }
  kj::Array<char>::~Array(&local_3e8);
  return;
}

Assistant:

void gatherForEncode(const JsonCodec& codec, DynamicValue::Reader input,
                       kj::StringPtr prefix, kj::StringPtr morePrefix,
                       kj::Vector<FlattenedField>& flattenedFields) const {
    kj::String ownPrefix;
    if (morePrefix.size() > 0) {
      if (prefix.size() > 0) {
        ownPrefix = kj::str(prefix, morePrefix);
        prefix = ownPrefix;
      } else {
        prefix = morePrefix;
      }
    }

    auto reader = input.as<DynamicStruct>();
    auto schema = reader.getSchema();
    for (auto field: schema.getNonUnionFields()) {
      auto& info = fields[field.getIndex()];
      if (!reader.has(field, codec.impl->hasMode)) {
        // skip
      } else KJ_IF_SOME(handler, info.flattenHandler) {
        handler.gatherForEncode(codec, reader.get(field), prefix, info.prefix, flattenedFields);
      } else {
        flattenedFields.add(FlattenedField {
            prefix, info.name, field, reader.get(field) });
      }
    }